

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

RandCaseStatementSyntax * __thiscall
slang::parsing::Parser::parseRandCaseStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  Token endCase;
  span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL> elements;
  Token randCase_00;
  Token colon_00;
  bool bVar1;
  int iVar2;
  ExpressionSyntax *expr_00;
  EmptyStatementSyntax *pEVar3;
  undefined4 extraout_var;
  RandCaseStatementSyntax *pRVar4;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  Token TVar5;
  Token TVar6;
  bool local_221;
  SyntaxList<slang::syntax::RandCaseItemSyntax> local_1a8;
  char local_178 [8];
  Info *pIStack_170;
  pointer local_168;
  size_type sStack_160;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_158;
  undefined8 uStack_128;
  Token endcase;
  RandCaseItemSyntax *local_100;
  _Storage<slang::DiagCode,_true> local_f8;
  uint local_f4;
  _Storage<slang::DiagCode,_true> local_ee;
  undefined2 local_ea;
  Token local_e8;
  SourceLocation local_d8;
  StatementSyntax *local_d0;
  StatementSyntax *stmt;
  Info *local_c0;
  SourceLocation local_b8;
  SourceLocation loc;
  Token colon;
  ExpressionSyntax *expr;
  TokenKind local_88;
  undefined1 local_78 [8];
  SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL> itemBuffer;
  Token randCase;
  NamedLabelSyntax *label_local;
  Parser *this_local;
  AttrList attributes_local;
  
  join_0x00000010_0x00000000_ = ParserBase::consume(&this->super_ParserBase);
  SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL> *)local_78);
  while( true ) {
    TVar5 = ParserBase::peek(&this->super_ParserBase);
    local_88 = TVar5.kind;
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(local_88);
    if (!bVar1) break;
    expr_00 = parseExpression(this);
    TVar5 = ParserBase::expect(&this->super_ParserBase,Colon);
    loc = TVar5._0_8_;
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    local_c0 = TVar6.info;
    stmt = TVar6._0_8_;
    local_b8 = Token::location((Token *)&stmt);
    local_d0 = parseStatement(this,true,false);
    local_221 = false;
    if ((local_d0->super_SyntaxNode).kind == EmptyStatement) {
      pEVar3 = slang::syntax::SyntaxNode::as<slang::syntax::EmptyStatementSyntax>
                         (&local_d0->super_SyntaxNode);
      bVar1 = Token::isMissing(&pEVar3->semicolon);
      local_221 = false;
      if (bVar1) {
        TVar6 = ParserBase::peek(&this->super_ParserBase);
        local_e8 = TVar6;
        local_d8 = Token::location(&local_e8);
        local_221 = SourceLocation::operator==(&local_b8,&local_d8);
      }
    }
    if (local_221 != false) {
      std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_ee);
      local_f4 = CONCAT22(local_f4._2_2_,local_ea);
      local_f8 = local_ee;
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)(uint)local_ee | (uint6)local_f4 << 0x20));
    }
    endcase.info = (Info *)loc;
    colon_00.info = TVar5.info;
    colon_00._0_8_ = loc;
    local_100 = slang::syntax::SyntaxFactory::randCaseItem(&this->factory,expr_00,colon_00,local_d0)
    ;
    SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::RandCaseItemSyntax_*> *)local_78,&local_100);
  }
  TVar5 = ParserBase::expect(&this->super_ParserBase,EndCaseKeyword);
  endcase._0_8_ = TVar5.info;
  uStack_128 = TVar5._0_8_;
  local_168 = attributes.data_;
  sStack_160 = attributes.size_;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (&local_158,attributes);
  TVar5 = stack0xffffffffffffffc8;
  local_178[0] = itemBuffer.stackBase[0x18];
  local_178[1] = itemBuffer.stackBase[0x19];
  local_178[2] = itemBuffer.stackBase[0x1a];
  local_178[3] = itemBuffer.stackBase[0x1b];
  local_178[4] = itemBuffer.stackBase[0x1c];
  local_178[5] = itemBuffer.stackBase[0x1d];
  local_178[6] = itemBuffer.stackBase[0x1e];
  local_178[7] = itemBuffer.stackBase[0x1f];
  pIStack_170 = (Info *)randCase._0_8_;
  unique0x10000543 = TVar5;
  iVar2 = SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::RandCaseItemSyntax_*> *)local_78,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  elements.data_._4_4_ = extraout_var;
  elements.data_._0_4_ = iVar2;
  elements.size_ = extraout_RDX;
  slang::syntax::SyntaxList<slang::syntax::RandCaseItemSyntax>::SyntaxList(&local_1a8,elements);
  randCase_00.info = pIStack_170;
  randCase_00._0_8_ = local_178;
  endCase.info = (Info *)endcase._0_8_;
  endCase.kind = (undefined2)uStack_128;
  endCase._2_1_ = uStack_128._2_1_;
  endCase.numFlags.raw = uStack_128._3_1_;
  endCase.rawLen = uStack_128._4_4_;
  pRVar4 = slang::syntax::SyntaxFactory::randCaseStatement
                     (&this->factory,label,&local_158,randCase_00,&local_1a8,endCase);
  SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL> *)local_78);
  return pRVar4;
}

Assistant:

RandCaseStatementSyntax& Parser::parseRandCaseStatement(NamedLabelSyntax* label,
                                                        AttrList attributes) {
    auto randCase = consume();
    SmallVector<RandCaseItemSyntax*> itemBuffer;

    while (isPossibleExpression(peek().kind)) {
        auto& expr = parseExpression();
        auto colon = expect(TokenKind::Colon);
        const auto loc = peek().location();
        auto& stmt = parseStatement();
        if (stmt.kind == SyntaxKind::EmptyStatement &&
            stmt.as<EmptyStatementSyntax>().semicolon.isMissing() && loc == peek().location()) {
            skipToken(std::nullopt);
        }
        itemBuffer.push_back(&factory.randCaseItem(expr, colon, stmt));
    }

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.randCaseStatement(label, attributes, randCase, itemBuffer.copy(alloc), endcase);
}